

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

void uv__signal_loop_cleanup(uv_loop_t *loop)

{
  uv_handle_t *handle;
  uv__queue *q;
  uv_loop_t *loop_local;
  
  for (handle = (uv_handle_t *)(loop->handle_queue).next;
      handle != (uv_handle_t *)&loop->handle_queue; handle = (uv_handle_t *)handle->data) {
    if (*(int *)&handle[-1].next_closing == 0x10) {
      uv__signal_stop((uv_signal_t *)((long)&handle[-1].u + 0x10));
    }
  }
  if (loop->signal_pipefd[0] != -1) {
    uv__close(loop->signal_pipefd[0]);
    loop->signal_pipefd[0] = -1;
  }
  if (loop->signal_pipefd[1] != -1) {
    uv__close(loop->signal_pipefd[1]);
    loop->signal_pipefd[1] = -1;
  }
  return;
}

Assistant:

void uv__signal_loop_cleanup(uv_loop_t* loop) {
  struct uv__queue* q;

  /* Stop all the signal watchers that are still attached to this loop. This
   * ensures that the (shared) signal tree doesn't contain any invalid entries
   * entries, and that signal handlers are removed when appropriate.
   * It's safe to use uv__queue_foreach here because the handles and the handle
   * queue are not modified by uv__signal_stop().
   */
  uv__queue_foreach(q, &loop->handle_queue) {
    uv_handle_t* handle = uv__queue_data(q, uv_handle_t, handle_queue);

    if (handle->type == UV_SIGNAL)
      uv__signal_stop((uv_signal_t*) handle);
  }

  if (loop->signal_pipefd[0] != -1) {
    uv__close(loop->signal_pipefd[0]);
    loop->signal_pipefd[0] = -1;
  }

  if (loop->signal_pipefd[1] != -1) {
    uv__close(loop->signal_pipefd[1]);
    loop->signal_pipefd[1] = -1;
  }
}